

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vr2i.cpp
# Opt level: O3

bool * __thiscall Vr2i::steps(Vr2i *this,int *n)

{
  uint uVar1;
  bool *pbVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  uVar4 = this->xv;
  uVar6 = this->yv;
  uVar1 = -uVar4;
  if (0 < (int)uVar4) {
    uVar1 = uVar4;
  }
  uVar4 = -uVar6;
  if (0 < (int)uVar6) {
    uVar4 = uVar6;
  }
  uVar6 = uVar1;
  if (uVar4 < uVar1) {
    uVar6 = uVar4;
  }
  if (uVar4 <= uVar1) {
    uVar4 = uVar1;
  }
  uVar5 = (ulong)uVar4;
  *n = uVar4;
  pbVar2 = (bool *)operator_new__(uVar5);
  if (uVar4 != 0) {
    uVar3 = 0;
    uVar8 = uVar5;
    do {
      iVar7 = (int)uVar8 + uVar6 * -2;
      uVar8 = (ulong)(iVar7 + (iVar7 >> 0x1f & uVar4 * 2));
      pbVar2[uVar3] = SUB41((uint)iVar7 >> 0x1f,0);
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  return pbVar2;
}

Assistant:

bool *Vr2i::steps (int *n) const
{
  int x2 = (xv > 0 ? xv : - xv);
  int y2 = (yv > 0 ? yv : - yv);
  int dx = x2, dy = y2;
  if (y2 > x2)
  {
    dx = y2;
    dy = x2;
    x2 = y2;
  }
  int e, x = 0, i = 0;
  *n = x2;
  bool *vecsteps = new bool[x2];

  e = dx;
  dx *= 2;
  dy *= 2;

  while (x < x2)
  {
    x ++;
    e -= dy;
    if (e < 0)
    {
      e += dx;
      vecsteps[i++] = true;
    }
    else vecsteps[i++] = false;
  }
  return (vecsteps); 
}